

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O2

void __thiscall
QSslConfiguration::setCaCertificates(QSslConfiguration *this,QList<QSslCertificate> *certificates)

{
  QSslConfigurationPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QSslConfigurationPrivate>::operator->(&this->d);
  QArrayDataPointer<QSslCertificate>::operator=(&(pQVar1->caCertificates).d,&certificates->d);
  pQVar1 = QSharedDataPointer<QSslConfigurationPrivate>::operator->(&this->d);
  pQVar1->allowRootCertOnDemandLoading = false;
  return;
}

Assistant:

void QSslConfiguration::setCaCertificates(const QList<QSslCertificate> &certificates)
{
    d->caCertificates = certificates;
    d->allowRootCertOnDemandLoading = false;
}